

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O2

GMM_STATUS __thiscall
GmmLib::GmmGen9TextureCalc::FillTex1D
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  uint32_t UnitAlignment;
  bool bVar1;
  uint32_t uVar2;
  uint32_t Width;
  uint32_t uVar3;
  anon_struct_8_44_94931171_for_Info aVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  GMM_STATUS GVar8;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t CompressHeight;
  uint32_t CompressDepth;
  ulong local_50;
  GMM_PLATFORM_INFO *local_48;
  uint local_40;
  uint local_3c;
  uint32_t CompressWidth;
  uint8_t local_31;
  
  if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    GVar8 = GMM_ERROR;
  }
  else {
    aVar4 = (anon_struct_8_44_94931171_for_Info)
            ((ulong)(pTexInfo->Flags).Info & 0xfffffff3fff7ffff | 0x80000);
    (pTexInfo->Flags).Info = aVar4;
    uVar6 = 0xffffffe3ffffffff;
    if (((uint)(((this->super_GmmTextureCalc).pGmmLibContext)->SkuTable).field_0 & 0x40) == 0) {
      uVar6 = 0xfffff7f3ffffffff;
    }
    (pTexInfo->Flags).Info = (anon_struct_8_44_94931171_for_Info)(uVar6 & (ulong)aVar4);
    local_48 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
    CompressWidth = pTexInfo->ArraySize;
    local_3c = CompressWidth + (CompressWidth == 0);
    local_50 = (ulong)pTexInfo->BitsPerPixel;
    UnitAlignment = (pTexInfo->Alignment).HAlign;
    local_31 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
    GmmTextureCalc::GetCompressionBlockDimensions
              (&this->super_GmmTextureCalc,pTexInfo->Format,&local_40,&local_60,&local_5c);
    if ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) != 0) {
      GmmTextureCalc::FindMipTailStartLod(&this->super_GmmTextureCalc,pTexInfo);
    }
    uVar2 = (uint32_t)pTexInfo->BaseWidth;
    if ((pTexInfo->Format == GMM_FORMAT_R8G8B8_UINT) &&
       ((*(uint *)&(pTexInfo->Flags).Info.field_0x1 & 0x8000800) != 0)) {
      uVar2 = (uVar2 + 0x3e) / 0x3f + uVar2;
    }
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
      uVar3 = 1;
    }
    else {
      uVar3 = (pTexInfo->MSAA).NumSamples;
    }
    uVar2 = GmmTextureCalc::ExpandWidth(&this->super_GmmTextureCalc,uVar2,UnitAlignment,uVar3);
    _CompressHeight = pRestrictions;
    if ((((ulong)(pTexInfo->Flags).Info & 0x106000000000) == 0) ||
       (((pTexInfo->Alignment).MipTailStartLod != 0 && (pTexInfo->MaxLod != 0)))) {
      for (uVar7 = 1; uVar7 <= pTexInfo->MaxLod; uVar7 = uVar7 + 1) {
        if ((((ulong)(pTexInfo->Flags).Info & 0x106000000000) != 0) &&
           (uVar7 == (pTexInfo->Alignment).MipTailStartLod)) {
          uVar2 = uVar2 + local_48->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
          break;
        }
        Width = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x18])
                          (this,pTexInfo,(ulong)uVar7);
        uVar3 = 1;
        if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
          uVar3 = (pTexInfo->MSAA).NumSamples;
        }
        uVar3 = GmmTextureCalc::ExpandWidth(&this->super_GmmTextureCalc,Width,UnitAlignment,uVar3);
        if (local_31 != '\0') {
          uVar3 = uVar3 / local_40;
        }
        uVar2 = uVar2 + uVar3;
      }
    }
    uVar3 = 0;
    if (1 < CompressWidth) {
      uVar3 = uVar2;
    }
    (pTexInfo->Alignment).QPitch = -UnitAlignment & (UnitAlignment - 1) + uVar3;
    pTexInfo->Pitch = 0;
    uVar6 = (ulong)local_3c * (ulong)(((uint)(local_50 >> 3) & 0x1fffffff) * uVar2) + 0xfff &
            0xfffffffffffff000;
    bVar1 = (long)uVar6 <= local_48->SurfaceMaxSize;
    if (bVar1) {
      pTexInfo->Size = uVar6;
      Fill1DTexOffsetAddress(this,pTexInfo);
    }
    GVar8 = (GMM_STATUS)!bVar1;
    uVar7 = (pTexInfo->Alignment).BaseAlignment;
    uVar5 = _CompressHeight->Alignment;
    if ((uVar7 != 0) && (uVar5 % uVar7 != 0)) {
      if (uVar7 % uVar5 == 0) {
        return GVar8;
      }
      uVar5 = uVar5 * uVar7;
    }
    (pTexInfo->Alignment).BaseAlignment = uVar5;
  }
  return GVar8;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen9TextureCalc::FillTex1D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   ArraySize, BitsPerPixel, HAlign, i, Width, MipWidth;
    int64_t    Size;
    GMM_STATUS Status = GMM_SUCCESS;
    uint8_t    Compressed;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);
    __GMM_ASSERT(pTexInfo->Flags.Info.Linear ||
                 pTexInfo->Flags.Info.TiledYf ||
                 GMM_IS_64KB_TILE(pTexInfo->Flags));

    pTexInfo->Flags.Info.Linear = 1;
    pTexInfo->Flags.Info.TiledW = 0;
    pTexInfo->Flags.Info.TiledX = 0;
    GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    ArraySize    = GFX_MAX(pTexInfo->ArraySize, 1);
    BitsPerPixel = pTexInfo->BitsPerPixel;
    HAlign       = pTexInfo->Alignment.HAlign;

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    if(pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags))
    {
        FindMipTailStartLod(pTexInfo);
    }

    /////////////////////////////
    // Calculate Surface QPitch
    /////////////////////////////
    Width = GFX_ULONG_CAST(pTexInfo->BaseWidth);
    if((pTexInfo->Format == GMM_FORMAT_R8G8B8_UINT) && (pTexInfo->Flags.Info.Linear || pTexInfo->Flags.Info.TiledX))
    {
        Width += GFX_CEIL_DIV(Width, 63);
    }
    Width    = __GMM_EXPAND_WIDTH(this, Width, HAlign, pTexInfo);
    MipWidth = Width;

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       ((pTexInfo->Alignment.MipTailStartLod == 0) || (pTexInfo->MaxLod == 0)))
    {
        // Do nothing. Width is already aligned.
    }
    else
    {
        for(i = 1; i <= pTexInfo->MaxLod; i++)
        {
            uint32_t AlignedMipWidth;

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (i == pTexInfo->Alignment.MipTailStartLod))
            {
                Width += pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
                break;
            }
            else
            {
                MipWidth = GFX_ULONG_CAST(GmmTexGetMipWidth(pTexInfo, i));

                AlignedMipWidth = __GMM_EXPAND_WIDTH(this, MipWidth, HAlign, pTexInfo);

                if(Compressed)
                {
                    AlignedMipWidth /= CompressWidth;
                }

                Width += AlignedMipWidth;
            }
        }
    }

    pTexInfo->Alignment.QPitch = GFX_ALIGN((ArraySize > 1) ? Width : 0, HAlign); // in pixels

    pTexInfo->Pitch = 0;

    ///////////////////////////
    // Calculate Surface Size
    ///////////////////////////

    Width *= BitsPerPixel >> 3;

    Size = GFX_ALIGN((uint64_t)Width * ArraySize, PAGE_SIZE);

    if(Size <= pPlatform->SurfaceMaxSize)
    {
        pTexInfo->Size = Size;

        Fill1DTexOffsetAddress(pTexInfo);
    }
    else
    {
        GMM_ASSERTDPF(0, "Surface too large!");
        Status = GMM_ERROR;
    }

    //////////////////////
    // Surface Alignment
    //////////////////////

    if(!pTexInfo->Alignment.BaseAlignment || __GMM_IS_ALIGN(pRestrictions->Alignment, pTexInfo->Alignment.BaseAlignment))
    {
        pTexInfo->Alignment.BaseAlignment = pRestrictions->Alignment;
    }
    else if(__GMM_IS_ALIGN(pTexInfo->Alignment.BaseAlignment, pRestrictions->Alignment))
    {
        // Do nothing: pTexInfo->Alignment.BaseAlignment is properly aligned
    }
    else
    {
        pTexInfo->Alignment.BaseAlignment = pTexInfo->Alignment.BaseAlignment * pRestrictions->Alignment;
        GMM_ASSERTDPF(0,
                      "Client requested alignment that is not properly aligned to HW requirements."
                      "Alignment is going to be much higher to match both client and HW requirements.\r\n");
    }

    GMM_DPF_EXIT;

    return (Status);
}